

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_string_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,char *value,
                       size_t length,_Bool use_smallest)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  _Bool use_smallest_local;
  size_t length_local;
  char *value_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  if (use_smallest) {
    iVar1 = output_byte(encoder_output,context,(uchar)length);
    if ((iVar1 == 0) && (iVar1 = output_bytes(encoder_output,context,value,length), iVar1 == 0)) {
      l._0_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"encode_string_value",0xdd7,1,"Failed encoding small string value");
      }
      l._0_4_ = 0xdd8;
    }
  }
  else {
    iVar1 = output_byte(encoder_output,context,(uchar)(length >> 0x18));
    if ((((iVar1 == 0) &&
         (iVar1 = output_byte(encoder_output,context,(uchar)(length >> 0x10)), iVar1 == 0)) &&
        (iVar1 = output_byte(encoder_output,context,(uchar)(length >> 8)), iVar1 == 0)) &&
       ((iVar1 = output_byte(encoder_output,context,(uchar)length), iVar1 == 0 &&
        (iVar1 = output_bytes(encoder_output,context,value,length), iVar1 == 0)))) {
      l._0_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"encode_string_value",0xdea,1,"Failed encoding large string value");
      }
      l._0_4_ = 0xdeb;
    }
  }
  return (int)l;
}

Assistant:

static int encode_string_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, const char* value, size_t length, bool use_smallest)
{
    int result;

    if (use_smallest)
    {
        /* Codes_SRS_AMQPVALUE_01_299: [<encoding name="str8-utf8" code="0xa1" category="variable" width="1" label="up to 2^8 - 1 octets worth of UTF-8 Unicode (with no byte order mark)"/>] */
        if ((output_byte(encoder_output, context, (unsigned char)length) != 0) ||
            (output_bytes(encoder_output, context, value, length) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding small string value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_300: [<encoding name="str32-utf8" code="0xb1" category="variable" width="4" label="up to 2^32 - 1 octets worth of UTF-8 Unicode (with no byte order mark)"/>] */
        if ((output_byte(encoder_output, context, (length >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (length >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (length >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, length & 0xFF) != 0) ||
            (output_bytes(encoder_output, context, value, length) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding large string value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    return result;

}